

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_option_function<int>
          (App *this,string *option_name,function<void_(const_int_&)> *func,
          string *option_description)

{
  Option *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  allocator<char> *in_RDI;
  Option *opt;
  anon_class_32_1_898bcfc2 fun;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_000004a8;
  undefined1 in_stack_000004b7;
  string *in_stack_000004b8;
  callback_t *in_stack_000004c0;
  string *in_stack_000004c8;
  App *in_stack_000004d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  Option *this_01;
  function<void_(const_int_&)> *in_stack_fffffffffffffec8;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff18;
  Option *in_stack_ffffffffffffff20;
  
  std::function<void_(const_int_&)>::function
            ((function<void_(const_int_&)> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ::std::__cxx11::string::string(in_stack_ffffffffffffff00,in_RSI);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_option_function<int>(std::__cxx11::string,std::function<void(int_const&)>const&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            (in_stack_fffffffffffffed0,(anon_class_32_1_898bcfc2 *)in_stack_fffffffffffffec8);
  ::std::__cxx11::string::string(in_stack_ffffffffffffff00,in_RSI);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_fffffffffffffec0);
  this_00 = add_option(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004b8,
                       (bool)in_stack_000004b7,in_stack_000004a8);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x356edc);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffec0);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x356ef6);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffec0);
  this_01 = this_00;
  CLI::detail::type_name<int,_(CLI::detail::enabler)0>();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_RSI,in_RDI);
  Option::type_name(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  Option::type_size(this_00,1,1);
  Option::expected(this_00,1);
  add_option_function<int>(std::__cxx11::string,std::function<void(int_const&)>const&,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)#1}::
  ~vector((anon_class_32_1_898bcfc2 *)0x356fb0);
  return this_00;
}

Assistant:

Option *add_option_function(std::string option_name,
                                const std::function<void(const ArgType &)> &func,  ///< the callback to execute
                                std::string option_description = "") {

        auto fun = [func](const CLI::results_t &res) {
            ArgType variable;
            bool result = detail::lexical_conversion<ArgType, ArgType>(res, variable);
            if(result) {
                func(variable);
            }
            return result;
        };

        Option *opt = add_option(option_name, std::move(fun), option_description, false);
        opt->type_name(detail::type_name<ArgType>());
        opt->type_size(detail::type_count_min<ArgType>::value, detail::type_count<ArgType>::value);
        opt->expected(detail::expected_count<ArgType>::value);
        return opt;
    }